

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::HeapArgumentsObject::GetPropertyQuery
          (HeapArgumentsObject *this,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  PropertyQueryFlags PVar3;
  char16 *str;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  
  str = JavascriptString::GetString(propertyNameString);
  length = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(str,length);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x169,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord*"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  PVar3 = DynamicObject::GetPropertyQuery
                    ((DynamicObject *)this,originalInstance,propertyNameString,value,info,
                     requestContext);
  if (PVar3 != Property_Found) {
    pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar5;
  }
  return (uint)(PVar3 == Property_Found);
}

Assistant:

PropertyQueryFlags HeapArgumentsObject::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {

        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord*");

        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext)))
        {
            // Property has been pre-set and not deleted. Use it.
            return PropertyQueryFlags::Property_Found;
        }

        *value = requestContext->GetMissingPropertyResult();
        return PropertyQueryFlags::Property_NotFound;
    }